

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeTree.cpp
# Opt level: O2

void __thiscall
Indexing::CodeTree::Compiler<true>::handleVar
          (Compiler<true> *this,uint var,Stack<unsigned_int> *globalCounterparts)

{
  bool bVar1;
  uint uVar2;
  CodeOp elem;
  CodeOp elem_00;
  uint *varNumPtr;
  uint *globalVarNumPtr;
  uint *local_30;
  uint *local_28;
  
  bVar1 = Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::getValuePtr
                    (&this->varMap,var,&local_30);
  if (bVar1) {
    uVar2 = this->nextVarNum;
    this->nextVarNum = uVar2 + 1;
    *local_30 = uVar2;
    elem._alternative = (CodeOp *)0x0;
    elem._content = (ulong)uVar2 * 8 + 4;
    Lib::Stack<Indexing::CodeTree::CodeOp>::push(this->code,elem);
    bVar1 = Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::getValuePtr
                      (&this->globalVarMap,var,&local_28);
    if (bVar1) {
      uVar2 = this->nextGlobalVarNum;
      this->nextGlobalVarNum = uVar2 + 1;
      *local_28 = uVar2;
    }
    else {
      uVar2 = *local_28;
    }
    Lib::Stack<unsigned_int>::push(globalCounterparts,uVar2);
  }
  else {
    elem_00._alternative = (CodeOp *)0x0;
    elem_00._content = (ulong)*local_30 * 8 + 5;
    Lib::Stack<Indexing::CodeTree::CodeOp>::push(this->code,elem_00);
  }
  return;
}

Assistant:

void CodeTree::Compiler<forLits>::handleVar(unsigned var, Stack<unsigned>* globalCounterparts)
{
  unsigned* varNumPtr;
  if (varMap.getValuePtr(var,varNumPtr)) {
    *varNumPtr = nextVarNum++;
    code.push(CodeOp::getTermOp(ASSIGN_VAR, *varNumPtr));

    if constexpr (forLits) {
      unsigned* globalVarNumPtr;
      if (globalVarMap.getValuePtr(var,globalVarNumPtr)) {
        *globalVarNumPtr = nextGlobalVarNum++;
      }
      globalCounterparts->push(*globalVarNumPtr);
    }
  } else {
    code.push(CodeOp::getTermOp(CHECK_VAR, *varNumPtr));
  }
}